

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5yyStackOverflow(fts5yyParser *fts5yypParser)

{
  ulong *in_RDI;
  Fts5Parse *pParse;
  fts5yyParser *pParser;
  
  pParser = (fts5yyParser *)in_RDI[1];
  while (in_RDI[3] < *in_RDI) {
    fts5yy_pop_parser_stack(pParser);
  }
  sqlite3Fts5ParseError((Fts5Parse *)pParser,"fts5: parser stack overflow");
  in_RDI[1] = (ulong)pParser;
  return;
}

Assistant:

static void fts5yyStackOverflow(fts5yyParser *fts5yypParser){
   sqlite3Fts5ParserARG_FETCH
   sqlite3Fts5ParserCTX_FETCH
#ifndef NDEBUG
   if( fts5yyTraceFILE ){
     fprintf(fts5yyTraceFILE,"%sStack Overflow!\n",fts5yyTracePrompt);
   }
#endif
   while( fts5yypParser->fts5yytos>fts5yypParser->fts5yystack ) fts5yy_pop_parser_stack(fts5yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/

  sqlite3Fts5ParseError(pParse, "fts5: parser stack overflow");
/******** End %stack_overflow code ********************************************/
   sqlite3Fts5ParserARG_STORE /* Suppress warning about unused %extra_argument var */
   sqlite3Fts5ParserCTX_STORE
}